

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int regNewData,int *aRegIdx,
               int update_flags,int appendBias,int useSeekResult)

{
  Op *pOVar1;
  int iVar2;
  Vdbe *p;
  byte bVar3;
  u16 uVar4;
  u16 uVar5;
  ushort uVar6;
  ulong uVar7;
  Index *pIVar8;
  ushort uVar9;
  
  p = sqlite3GetVdbe(pParse);
  pIVar8 = pTab->pIndex;
  if (pIVar8 == (Index *)0x0) {
    uVar7 = 0;
  }
  else {
    bVar3 = (useSeekResult != 0) << 4;
    uVar7 = 0;
    do {
      if (aRegIdx[uVar7] != 0) {
        if (pIVar8->pPartIdxWhere != (Expr *)0x0) {
          sqlite3VdbeAddOp3(p,0x32,aRegIdx[uVar7],p->nOp + 2,0);
        }
        uVar9 = (ushort)bVar3;
        if ((*(ushort *)&pIVar8->field_0x63 & 3) == 2) {
          uVar9 = (ushort)(byte)(((byte)update_flags & 2 | bVar3) + 1);
          if ((pTab->tabFlags & 0x20) == 0) {
            uVar9 = (ushort)bVar3;
          }
        }
        uVar6 = (&pIVar8->nKeyCol)[(*(ushort *)&pIVar8->field_0x63 & 8) == 0];
        iVar2 = sqlite3VdbeAddOp3(p,0x84,iIdxCur + (int)uVar7,aRegIdx[uVar7],aRegIdx[uVar7] + 1);
        if (p->db->mallocFailed == '\0') {
          pOVar1 = p->aOp;
          pOVar1[iVar2].p4type = -3;
          *(uint *)&pOVar1[iVar2].p4 = (uint)uVar6;
        }
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = uVar9;
        }
      }
      uVar7 = uVar7 + 1;
      pIVar8 = pIVar8->pNext;
    } while (pIVar8 != (Index *)0x0);
    uVar7 = uVar7 & 0xffffffff;
  }
  if ((pTab->tabFlags & 0x20) == 0) {
    uVar5 = 0x21;
    if (update_flags != 0) {
      uVar5 = (ushort)(byte)((byte)update_flags | 1);
    }
    uVar4 = 0;
    if (pParse->nested == '\0') {
      uVar4 = uVar5;
    }
    uVar9 = (ushort)(byte)((byte)uVar4 | 8);
    if (appendBias == 0) {
      uVar9 = uVar4;
    }
    uVar6 = (ushort)(byte)((byte)uVar9 | 0x10);
    if (useSeekResult == 0) {
      uVar6 = uVar9;
    }
    sqlite3VdbeAddOp3(p,0x7a,iDataCur,aRegIdx[uVar7],regNewData);
    if ((pParse->nested == '\0') && (p->db->mallocFailed == '\0')) {
      pOVar1 = p->aOp;
      iVar2 = p->nOp;
      pOVar1[(long)iVar2 + -1].p4type = -6;
      pOVar1[(long)iVar2 + -1].p4.pTab = pTab;
    }
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = uVar6;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int iDataCur,       /* Cursor of the canonical data source */
  int iIdxCur,        /* First index cursor */
  int regNewData,     /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int update_flags,   /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  Vdbe *v;            /* Prepared statements under construction */
  Index *pIdx;        /* An index being inserted or updated */
  u8 pik_flags;       /* flag values passed to the btree insert */
  int i;              /* Loop counter */

  assert( update_flags==0
       || update_flags==OPFLAG_ISUPDATE
       || update_flags==(OPFLAG_ISUPDATE|OPFLAG_SAVEPOSITION)
  );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    if( aRegIdx[i]==0 ) continue;
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_IsNull, aRegIdx[i], sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
    }
    pik_flags = (useSeekResult ? OPFLAG_USESEEKRESULT : 0);
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      assert( pParse->nested==0 );
      pik_flags |= OPFLAG_NCHANGE;
      pik_flags |= (update_flags & OPFLAG_SAVEPOSITION);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
      if( update_flags==0 ){
        int r = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Integer, 0, r);
        sqlite3VdbeAddOp4(v, OP_Insert, 
            iIdxCur+i, aRegIdx[i], r, (char*)pTab, P4_TABLE
        );
        sqlite3VdbeChangeP5(v, OPFLAG_ISNOOP);
        sqlite3ReleaseTempReg(pParse, r);
      }
#endif
    }
    sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iIdxCur+i, aRegIdx[i],
                         aRegIdx[i]+1,
                         pIdx->uniqNotNull ? pIdx->nKeyCol: pIdx->nColumn);
    sqlite3VdbeChangeP5(v, pik_flags);
  }
  if( !HasRowid(pTab) ) return;
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (update_flags?update_flags:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, iDataCur, aRegIdx[i], regNewData);
  if( !pParse->nested ){
    sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}